

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::ConvertIntArg<unsigned_char>
               (uchar v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  undefined8 this;
  FormatConversionChar FVar1;
  LengthMod LVar2;
  bool bVar3;
  FormatSinkImpl *in_R8;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  bool local_e9;
  undefined1 local_78 [8];
  IntDigits as_digits;
  FormatSinkImpl *sink_local;
  uchar v_local;
  IntDigits *local_18;
  FormatConversionSpecImpl conv_local;
  
  conv_local._0_4_ = conv.precision_;
  local_18 = conv._0_8_;
  as_digits._56_8_ = sink;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_18);
  switch(FVar1) {
  case c:
    LVar2 = FormatConversionSpecImpl::length_mod((FormatConversionSpecImpl *)&local_18);
    conv_00.precision_ = as_digits.storage_._40_4_;
    if (LVar2 == l) {
      conv_00.width_ = 0;
      conv_00.conv_ = conv_local.conv_;
      conv_00.flags_ = conv_local.flags_;
      conv_00.length_mod_ = conv_local.length_mod_;
      conv_00._3_1_ = conv_local._3_1_;
      local_e9 = anon_unknown_53::ConvertWCharTImpl
                           ((anon_unknown_53 *)(ulong)v,(wchar_t)local_18,conv_00,in_R8);
    }
    else {
      conv_01.width_ = 0;
      conv_01.conv_ = conv_local.conv_;
      conv_01.flags_ = conv_local.flags_;
      conv_01.length_mod_ = conv_local.length_mod_;
      conv_01._3_1_ = conv_local._3_1_;
      conv_01.precision_ = conv_00.precision_;
      local_e9 = anon_unknown_53::ConvertCharImpl
                           ((anon_unknown_53 *)(ulong)(uint)(int)(char)v,(char)local_18,conv_01,
                            in_R8);
    }
    return local_e9;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned char]"
                 );
  case d:
  case i:
  case v:
    anon_unknown_53::IntDigits::PrintAsDec<unsigned_char>((IntDigits *)local_78,v);
    break;
  case o:
    anon_unknown_53::IntDigits::PrintAsOct<unsigned_char>((IntDigits *)local_78,v);
    break;
  case u:
    anon_unknown_53::IntDigits::PrintAsDec<unsigned_char>((IntDigits *)local_78,v);
    break;
  case x:
    anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_char>((IntDigits *)local_78,v);
    break;
  case X:
    anon_unknown_53::IntDigits::PrintAsHexUpper<unsigned_char>((IntDigits *)local_78,v);
    break;
  case f:
  case F:
  case e:
  case E:
  case g:
  case G:
  case a:
  case A:
    bVar3 = ConvertFloatImpl((double)v,(FormatConversionSpecImpl *)&local_18,
                             (FormatSinkImpl *)as_digits._56_8_);
    return bVar3;
  }
  bVar3 = FormatConversionSpecImpl::is_basic((FormatConversionSpecImpl *)&local_18);
  this = as_digits._56_8_;
  if (bVar3) {
    v_00 = anon_unknown_53::IntDigits::with_neg_and_zero((IntDigits *)local_78);
    FormatSinkImpl::Append((FormatSinkImpl *)this,v_00);
    conv_local.width_._3_1_ = true;
  }
  else {
    conv_02.width_ = 0;
    conv_02.conv_ = conv_local.conv_;
    conv_02.flags_ = conv_local.flags_;
    conv_02.length_mod_ = conv_local.length_mod_;
    conv_02._3_1_ = conv_local._3_1_;
    conv_02.precision_ = as_digits.storage_._40_4_;
    conv_local.width_._3_1_ =
         anon_unknown_53::ConvertIntImplInnerSlow
                   ((anon_unknown_53 *)local_78,local_18,conv_02,in_R8);
  }
  return conv_local.width_._3_1_;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}